

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void enableRawMouseMotion(_GLFWwindow *window)

{
  undefined1 local_23 [2];
  byte local_21;
  undefined1 local_20 [5];
  uchar mask [3];
  XIEventMask em;
  _GLFWwindow *window_local;
  
  memset(local_23,0,3);
  local_20._0_4_ = 1;
  stack0xffffffffffffffe4 = 3;
  local_21 = local_21 | 2;
  (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,(XIEventMask *)local_20,1);
  return;
}

Assistant:

static void enableRawMouseMotion(_GLFWwindow* window)
{
    XIEventMask em;
    unsigned char mask[XIMaskLen(XI_RawMotion)] = { 0 };

    em.deviceid = XIAllMasterDevices;
    em.mask_len = sizeof(mask);
    em.mask = mask;
    XISetMask(mask, XI_RawMotion);

    XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
}